

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputs_Col100(Fts5Iter *pIter,Fts5SegIter *pSeg)

{
  int iVar1;
  byte *pbVar2;
  int *piVar3;
  byte *pbVar4;
  long in_RSI;
  undefined8 *in_RDI;
  int iPrevOut;
  u8 *aOut;
  int *aiColEnd;
  int *aiCol;
  int iPrev;
  u8 *pEnd;
  u8 *a;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar5;
  Fts5Iter *in_stack_ffffffffffffffc0;
  char *pcVar6;
  int *local_30;
  int local_24;
  byte *local_18;
  
  if ((long)*(int *)(*(long *)(in_RSI + 0x10) + 0xc) <
      *(long *)(in_RSI + 0x20) + (long)*(int *)(in_RSI + 0x78)) {
    fts5IterSetOutputs_Col
              (in_stack_ffffffffffffffc0,
               (Fts5SegIter *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    pbVar2 = (byte *)(**(long **)(in_RSI + 0x10) + *(long *)(in_RSI + 0x20));
    iVar1 = *(int *)(in_RSI + 0x78);
    local_24 = 0;
    local_30 = (int *)(in_RDI[7] + 4);
    piVar3 = local_30 + *(int *)in_RDI[7];
    *in_RDI = *(undefined8 *)(in_RSI + 0x70);
    iVar5 = 0;
    pcVar6 = (char *)in_RDI[5];
    local_18 = pbVar2;
    while (local_18 < pbVar2 + iVar1) {
      pbVar4 = local_18 + 1;
      local_24 = (*local_18 - 2) + local_24;
      while (*local_30 < local_24) {
        local_30 = local_30 + 1;
        if (local_30 == piVar3) goto LAB_00281a51;
      }
      local_18 = pbVar4;
      if (*local_30 == local_24) {
        *pcVar6 = ((char)local_24 - (char)iVar5) + '\x02';
        iVar5 = local_24;
        pcVar6 = pcVar6 + 1;
      }
    }
LAB_00281a51:
    in_RDI[1] = in_RDI[5];
    *(int *)(in_RDI + 2) = (int)pcVar6 - (int)in_RDI[5];
  }
  return;
}

Assistant:

static void fts5IterSetOutputs_Col100(Fts5Iter *pIter, Fts5SegIter *pSeg){

  assert( pIter->pIndex->pConfig->eDetail==FTS5_DETAIL_COLUMNS );
  assert( pIter->pColset );

  if( pSeg->iLeafOffset+pSeg->nPos>pSeg->pLeaf->szLeaf ){
    fts5IterSetOutputs_Col(pIter, pSeg);
  }else{
    u8 *a = (u8*)&pSeg->pLeaf->p[pSeg->iLeafOffset];
    u8 *pEnd = (u8*)&a[pSeg->nPos];
    int iPrev = 0;
    int *aiCol = pIter->pColset->aiCol;
    int *aiColEnd = &aiCol[pIter->pColset->nCol];

    u8 *aOut = pIter->poslist.p;
    int iPrevOut = 0;

    pIter->base.iRowid = pSeg->iRowid;

    while( a<pEnd ){
      iPrev += (int)a++[0] - 2;
      while( *aiCol<iPrev ){
        aiCol++;
        if( aiCol==aiColEnd ) goto setoutputs_col_out;
      }
      if( *aiCol==iPrev ){
        *aOut++ = (u8)((iPrev - iPrevOut) + 2);
        iPrevOut = iPrev;
      }
    }

setoutputs_col_out:
    pIter->base.pData = pIter->poslist.p;
    pIter->base.nData = aOut - pIter->poslist.p;
  }
}